

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O2

void wallet::wallet_crypto_tests::TestCrypter::TestDecrypt
               (CCrypter *crypt,span<const_unsigned_char,_18446744073709551615UL> ciphertext,
               span<const_unsigned_char,_18446744073709551615UL> correct_plaintext)

{
  long lVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  __extent_storage<18446744073709551615UL> _Var3;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char *local_90;
  equal_coll_impl local_81;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  CKeyingMaterial decrypted;
  
  _Var2 = correct_plaintext._M_extent._M_extent_value;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var3._M_extent_value = _Var2._M_extent_value;
  CCrypter::Decrypt(crypt,ciphertext,&decrypted);
  if ((iterator)_Var2._M_extent_value != (iterator)0x0) {
    local_58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_50 = "";
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_60 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)_Var3._M_extent_value;
    file.m_end = (iterator)0x37;
    file.m_begin = (iterator)&local_58;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_80,&local_81,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                )correct_plaintext._M_ptr,
               (__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                )(correct_plaintext._M_ptr + _Var2._M_extent_value));
    local_a8.m_empty = false;
    local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = "";
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_b0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_80,&local_a8,1,0xd,4,0xc82efd,(size_t)&local_b8,0x37,"decrypted.end()",
               "correct_plaintext.begin()","correct_plaintext.end()");
    boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&decrypted.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestDecrypt(const CCrypter& crypt, const std::span<const unsigned char> ciphertext,
                        const std::span<const unsigned char> correct_plaintext = {})
{
    CKeyingMaterial decrypted;
    crypt.Decrypt(ciphertext, decrypted);
    if (!correct_plaintext.empty()) {
        BOOST_CHECK_EQUAL_COLLECTIONS(decrypted.begin(), decrypted.end(), correct_plaintext.begin(), correct_plaintext.end());
    }
}